

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

void __thiscall libtorrent::append_path(libtorrent *this,string *branch,string_view leaf)

{
  bool bVar1;
  
  if (*(long *)(this + 8) != 0) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this,".");
    if (!bVar1) {
      if (branch != (string *)0x0) {
        if (*(char *)(*(long *)this + -1 + *(long *)(this + 8)) != '/') {
          ::std::__cxx11::string::push_back((char)this);
        }
        ::std::__cxx11::string::append((char *)this,leaf._M_len);
        return;
      }
      return;
    }
  }
  ::std::__cxx11::string::assign((char *)this,leaf._M_len);
  return;
}

Assistant:

void append_path(std::string& branch, string_view leaf)
	{
		TORRENT_ASSERT(!is_complete(leaf));
		if (branch.empty() || branch == ".")
		{
			branch.assign(leaf.data(), leaf.size());
			return;
		}
		if (leaf.empty()) return;

#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
#define TORRENT_SEPARATOR_CHAR '\\'
		bool const need_sep = branch[branch.size()-1] != '\\'
			&& branch[branch.size()-1] != '/';
#else
#define TORRENT_SEPARATOR_CHAR '/'
		bool const need_sep = branch[branch.size()-1] != '/';
#endif

		if (need_sep) branch += TORRENT_SEPARATOR_CHAR;
		branch.append(leaf.data(), leaf.size());
	}